

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O3

void __thiscall
t_ocaml_generator::generate_ocaml_struct_sig
          (t_ocaml_generator *this,ostream *out,t_struct *tstruct,bool is_exception)

{
  int *piVar1;
  pointer pcVar2;
  long lVar3;
  int iVar4;
  ostream *poVar5;
  undefined7 in_register_00000009;
  char *pcVar6;
  pointer pptVar7;
  string mname;
  string tname;
  string type;
  string x;
  char *local_120;
  char local_110;
  undefined7 uStack_10f;
  undefined8 uStack_108;
  undefined4 local_fc;
  string local_f8;
  t_struct *local_d8;
  char *local_d0;
  long local_c8;
  char local_c0;
  undefined7 uStack_bf;
  undefined8 uStack_b8;
  string local_b0;
  char *local_90;
  long local_88;
  char local_80;
  undefined7 uStack_7f;
  undefined8 uStack_78;
  string local_70;
  string local_50;
  
  local_d8 = tstruct;
  type_name_abi_cxx11_(&local_f8,this,&tstruct->super_t_type);
  poVar5 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"class ",6);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_f8._M_dataplus._M_p,local_f8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," :",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar5 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"object (\'a)",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"_x","");
  t_generator::tmp(&local_50,(t_generator *)this,&local_70);
  local_fc = (undefined4)CONCAT71(in_register_00000009,is_exception);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pptVar7 = (local_d8->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((local_d8->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish != pptVar7) {
    do {
      pcVar2 = ((*pptVar7)->name_)._M_dataplus._M_p;
      local_90 = &local_80;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar2,pcVar2 + ((*pptVar7)->name_)._M_string_length);
      pcVar6 = local_90;
      iVar4 = tolower((int)*local_90);
      *pcVar6 = (char)iVar4;
      lVar3 = local_88;
      local_120 = &local_110;
      if (local_90 == &local_80) {
        uStack_108 = uStack_78;
      }
      else {
        local_120 = local_90;
      }
      _local_110 = CONCAT71(uStack_7f,local_80);
      local_88 = 0;
      local_80 = '\0';
      local_90 = &local_80;
      render_ocaml_type_abi_cxx11_(&local_b0,this,(*pptVar7)->type_);
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"method get_",0xb);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_120,lVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," : ",3);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_b0._M_dataplus._M_p,local_b0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," option",7);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"method grab_",0xc);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_120,lVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," : ",3);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_b0._M_dataplus._M_p,local_b0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"method set_",0xb);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_120,lVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," : ",3);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_b0._M_dataplus._M_p,local_b0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," -> unit",8);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((*pptVar7)->value_ == (t_const_value *)0x0) {
        poVar5 = t_generator::indent((t_generator *)this,out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"method unset_",0xd);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_120,lVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," : unit",7);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      }
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"method reset_",0xd);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_120,lVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," : unit",7);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if (local_120 != &local_110) {
        operator_delete(local_120);
      }
      pptVar7 = pptVar7 + 1;
    } while (pptVar7 !=
             (local_d8->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  poVar5 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"method copy : \'a",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar5 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"method write : Protocol.t -> unit",0x21);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar5 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"end",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((char)local_fc != '\0') {
    poVar5 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"exception ",10);
    local_d0 = &local_c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,local_f8._M_dataplus._M_p,
               local_f8._M_dataplus._M_p + local_f8._M_string_length);
    pcVar6 = local_d0;
    iVar4 = toupper((int)*local_d0);
    *pcVar6 = (char)iVar4;
    lVar3 = local_c8;
    pcVar6 = local_d0;
    if (local_d0 == &local_c0) {
      uStack_108 = uStack_b8;
      pcVar6 = &local_110;
    }
    _local_110 = CONCAT71(uStack_bf,local_c0);
    local_c8 = 0;
    local_c0 = '\0';
    local_d0 = &local_c0;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,lVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," of ",4);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_f8._M_dataplus._M_p,local_f8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if (pcVar6 != &local_110) {
      operator_delete(pcVar6);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0);
    }
  }
  poVar5 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"val read_",9);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_f8._M_dataplus._M_p,local_f8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," : Protocol.t -> ",0x11);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_f8._M_dataplus._M_p,local_f8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_ocaml_generator::generate_ocaml_struct_sig(ostream& out,
                                                  t_struct* tstruct,
                                                  bool is_exception) {
  const vector<t_field*>& members = tstruct->get_members();
  vector<t_field*>::const_iterator m_iter;
  string tname = type_name(tstruct);
  indent(out) << "class " << tname << " :" << endl;
  indent(out) << "object ('a)" << endl;

  indent_up();

  string x = tmp("_x");
  if (members.size() > 0) {
    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
      string mname = decapitalize((*m_iter)->get_name());
      string type = render_ocaml_type((*m_iter)->get_type());
      indent(out) << "method get_" << mname << " : " << type << " option" << endl;
      indent(out) << "method grab_" << mname << " : " << type << endl;
      indent(out) << "method set_" << mname << " : " << type << " -> unit" << endl;
      if (!struct_member_persistent(*m_iter))
        indent(out) << "method unset_" << mname << " : unit" << endl;
      indent(out) << "method reset_" << mname << " : unit" << endl;
    }
  }
  indent(out) << "method copy : 'a" << endl;
  indent(out) << "method write : Protocol.t -> unit" << endl;
  indent_down();
  indent(out) << "end" << endl;

  if (is_exception) {
    indent(out) << "exception " << capitalize(tname) << " of " << tname << endl;
  }

  indent(out) << "val read_" << tname << " : Protocol.t -> " << tname << endl;
}